

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O0

void __thiscall Am_Filename::Am_Filename(Am_Filename *this,Am_Filename *dir,Am_Filename *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  Am_Filename *name_local;
  Am_Filename *dir_local;
  Am_Filename *this_local;
  
  local_20 = (string *)name;
  name_local = dir;
  dir_local = this;
  bVar1 = Is_Relative(name);
  if (bVar1) {
    std::operator+(local_40,(char *)name_local);
    std::operator+(&this->filename,local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    std::__cxx11::string::string((string *)this,local_20);
  }
  return;
}

Assistant:

Am_Filename::Am_Filename(const Am_Filename &dir, const Am_Filename &name)
    : filename(name.Is_Relative() ? dir.filename + "/" + name.filename
                                  : name.filename) // UNIX-specific
{
}